

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::Resize
          (TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_> *this,
          hash_t nhsize)

{
  Node *block;
  Node *pNVar1;
  ulong uVar2;
  FString *other;
  
  uVar2 = (ulong)this->Size;
  block = this->Nodes;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  if (uVar2 != 0) {
    other = &(block->Pair).Value.filename;
    do {
      if (*(long *)(other + -3) != 1) {
        pNVar1 = NewKey(this,*(int *)(other + -2));
        (pNVar1->Pair).Value.classname.Index = (((MapinfoSpawnItem *)(other + -1))->classname).Index
        ;
        FString::AttachToOther(&(pNVar1->Pair).Value.filename,other);
        (pNVar1->Pair).Value.linenum = *(int *)(other + 1);
        FString::~FString(other);
      }
      other = other + 5;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}